

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Stand(Map *this,Character *from)

{
  _List_node_base *p_Var1;
  Character *pCVar2;
  bool bVar3;
  PacketBuilder builder;
  PacketBuilder PStack_58;
  
  from->sitting = SIT_STAND;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder(&PStack_58,PACKET_SIT,PACKET_REMOVE,4);
  PacketBuilder::AddShort(&PStack_58,(unsigned_short)from->player->id);
  PacketBuilder::AddChar(&PStack_58,from->x);
  PacketBuilder::AddChar(&PStack_58,from->y);
  for (p_Var1 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->characters; p_Var1 = p_Var1->_M_next) {
    pCVar2 = (Character *)p_Var1[1]._M_next;
    if ((((pCVar2 != from) && (from->nowhere == false)) && (pCVar2->nowhere == false)) &&
       (bVar3 = Character::InRange(from,pCVar2->x,pCVar2->y), bVar3)) {
      EOClient::Send(pCVar2->player->client,&PStack_58);
    }
  }
  PacketBuilder::~PacketBuilder(&PStack_58);
  return;
}

Assistant:

void Map::Stand(Character *from)
{
	from->sitting = SIT_STAND;

	from->CancelSpell();

	PacketBuilder builder(PACKET_SIT, PACKET_REMOVE, 4);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}